

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O1

int __thiscall ON_wString::Length(ON_wString *this)

{
  ON_Internal_Empty_wString *pOVar1;
  
  pOVar1 = &empty_wstring;
  if (this->m_s != (wchar_t *)0x0) {
    pOVar1 = (ON_Internal_Empty_wString *)(this->m_s + -3);
  }
  return (pOVar1->header).string_length;
}

Assistant:

ON_wStringHeader* ON_wString::Header() const
{
  ON_wStringHeader* hdr = (ON_wStringHeader*)m_s;
  if (hdr)
    hdr--;
  else
    hdr = &empty_wstring.header;
  return hdr;
}